

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

void __thiscall kratos::Generator::unwire(Generator *this,Var *var1,Var *var2)

{
  pointer psVar1;
  pointer psVar2;
  shared_ptr<kratos::AssignStmt> sVar3;
  undefined1 auStack_58 [8];
  shared_ptr<kratos::Stmt> target;
  undefined1 local_40 [8];
  shared_ptr<kratos::AssignStmt> assign_stmt;
  
  auStack_58 = (undefined1  [8])0x0;
  target.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  psVar2 = (this->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (psVar2 == psVar1) {
LAB_0015b23d:
      if (auStack_58 != (undefined1  [8])0x0) {
        sVar3 = Stmt::as<kratos::AssignStmt>((Stmt *)local_40);
        (*((*(Var **)((long)local_40 + 0xc0))->super_IRNode)._vptr_IRNode[0x13])
                  (*(Var **)((long)local_40 + 0xc0),local_40,
                   sVar3.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._M_pi);
        (*((*(Var **)((long)local_40 + 200))->super_IRNode)._vptr_IRNode[0xf])();
        remove_stmt(this,(shared_ptr<kratos::Stmt> *)auStack_58);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&assign_stmt);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&target);
      return;
    }
    if (((psVar2->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type_ ==
        Assign) {
      Stmt::as<kratos::AssignStmt>((Stmt *)local_40);
      if ((*(Var **)((long)local_40 + 200) == var2 && *(Var **)((long)local_40 + 0xc0) == var1) ||
         (*(Var **)((long)local_40 + 0xc0) == var2 && *(Var **)((long)local_40 + 200) == var1)) {
        std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)auStack_58,
                   (__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)local_40);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&assign_stmt);
        goto LAB_0015b23d;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&assign_stmt);
    }
    psVar2 = psVar2 + 1;
  } while( true );
}

Assistant:

void Generator::unwire(Var &var1, Var &var2) {
    // brute force search matching statement
    std::shared_ptr<Stmt> target = nullptr;
    for (auto const &stmt : stmts_) {
        if (stmt->type() == StatementType::Assign) {
            auto assign_stmt = stmt->as<AssignStmt>();
            if ((assign_stmt->left() == &var1 && assign_stmt->right() == &var2) ||
                (assign_stmt->right() == &var1 && assign_stmt->left() == &var2)) {
                target = assign_stmt;
                break;
            }
        }
    }
    if (target) {
        auto assign_stmt = target->as<AssignStmt>();
        assign_stmt->left()->remove_source(assign_stmt);
        assign_stmt->right()->remove_sink(assign_stmt);
        remove_stmt(target);
    }
}